

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::Print
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this,char *name,
          ostream *out,MatrixOutputFormat form)

{
  ostream *poVar1;
  void *pvVar2;
  int64_t iVar3;
  int *piVar4;
  ostream *in_RDX;
  long in_RDI;
  ostream *in_stack_00000010;
  char *in_stack_00000018;
  int64_t i;
  ostream *in_stack_00002300;
  char *in_stack_00002308;
  TPZFileEqnStorage<float> *in_stack_00002310;
  long local_28;
  
  poVar1 = std::operator<<(in_RDX,"Frontal Matrix associated");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TPZFrontNonSym<float>::Print((TPZFrontNonSym<float> *)i,in_stack_00000018,in_stack_00000010);
  poVar1 = std::operator<<(in_RDX,"Stored Equations");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TPZFileEqnStorage<float>::Print(in_stack_00002310,in_stack_00002308,in_stack_00002300);
  poVar1 = std::operator<<(in_RDX,"Number of Equations ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(long *)(in_RDI + 0x200));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Number of Elements connected to DF");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_28 = 0;
  while( true ) {
    iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x210));
    if (iVar3 <= local_28) break;
    poVar1 = (ostream *)std::ostream::operator<<(in_RDX,local_28);
    poVar1 = std::operator<<(poVar1," ");
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x210),local_28);
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*piVar4);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const
{
	int64_t i;
	out << "Frontal Matrix associated"<< endl;
	fFront.Print(name, out);
	out << "Stored Equations" << endl;
	fStorage.Print(name, out);
	out << "Number of Equations " << fNumEq << endl;
	out << "Number of Elements connected to DF" << endl;
	for(i=0;i<fNumElConnected.NElements();i++){
		out << i << " " << fNumElConnected[i] << endl;
	}
}